

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

uint32_t verify_miniscript_or_i_property(uint32_t x_property,uint32_t y_property)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = y_property & x_property;
  if ((uVar1 & 7) != 0) {
    uVar2 = y_property | x_property;
    return (uVar2 * 2 & uVar1 & 0x10000) +
           (uVar2 >> 1 & uVar2 & 0x2000 | (uVar2 & 0x800 | uVar1 & 0xd007) + (uVar1 & 0x100) * 2) +
           0x20000;
  }
  return 0;
}

Assistant:

static uint32_t verify_miniscript_or_i_property(uint32_t x_property, uint32_t y_property)
{
    uint32_t prop = MINISCRIPT_PROPERTY_X;
    prop |= x_property & y_property &
            (MINISCRIPT_TYPE_V | MINISCRIPT_TYPE_B | MINISCRIPT_TYPE_K |
             MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_F | MINISCRIPT_PROPERTY_S);
    if (!(prop & MINISCRIPT_TYPE_MASK))
        return 0;

    prop |= (x_property | y_property) & MINISCRIPT_PROPERTY_D;
    if ((x_property & y_property) & MINISCRIPT_PROPERTY_Z)
        prop |= MINISCRIPT_PROPERTY_O;
    if ((x_property | y_property) & MINISCRIPT_PROPERTY_F)
        prop |= (x_property | y_property) & MINISCRIPT_PROPERTY_E;
    if ((x_property | y_property) & MINISCRIPT_PROPERTY_S)
        prop |= x_property & y_property & MINISCRIPT_PROPERTY_M;

    return prop;
}